

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  tm *ptVar4;
  info *piVar5;
  locale loc;
  allocator local_431;
  locale l;
  char buf [1024];
  
  std::operator<<((ostream *)&std::cout,"- Backends: ");
  poVar1 = std::operator<<((ostream *)&std::cout,"icu:");
  poVar1 = std::operator<<(poVar1,"70.1");
  std::operator<<(poVar1," ");
  std::operator<<((ostream *)&std::cout,"std ");
  std::operator<<((ostream *)&std::cout,"posix ");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"- With iconv");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Environment ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  LANG=");
  pcVar2 = env("LANG");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  LC_ALL=");
  pcVar2 = env("LC_ALL");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  LC_CTYPE=");
  pcVar2 = env("LC_CTYPE");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  TZ=");
  pcVar2 = env("TZ");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  pcVar3 = setlocale(6,"");
  pcVar2 = "undetected";
  if (pcVar3 != (char *)0x0) {
    pcVar2 = pcVar3;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"- C locale: ");
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::locale::locale(&loc,"");
  poVar1 = std::operator<<((ostream *)&std::cout,"- C++ locale: ");
  std::locale::name_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,(string *)buf);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)buf);
  std::locale::~locale(&loc);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "- Testing locales availability on the operation system:");
  std::endl<char,std::char_traits<char>>(poVar1);
  check_locale(&PTR_anon_var_dwarf_3245_00104cc0);
  poVar1 = std::operator<<((ostream *)&std::cout,"--- Testing Japanese_Japan.932 is working: ");
  std::__cxx11::string::string((string *)buf,"Japanese_Japan.932",(allocator *)&loc);
  test_std_supports_SJIS_codecvt((string *)buf);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)buf);
  poVar1 = std::operator<<((ostream *)&std::cout,"- Testing timezone and time ");
  std::endl<char,std::char_traits<char>>(poVar1);
  setlocale(6,"C");
  _loc = time((time_t *)0x0);
  ptVar4 = localtime((time_t *)&loc);
  strftime(buf,0x400,"%%c=%c; %%Z=%Z; %%z=%z",ptVar4);
  poVar1 = std::operator<<((ostream *)&std::cout,"  Local Time    :");
  poVar1 = std::operator<<(poVar1,buf);
  std::endl<char,std::char_traits<char>>(poVar1);
  ptVar4 = gmtime((time_t *)&loc);
  strftime(buf,0x400,"%%c=%c; %%Z=%Z; %%z=%z",ptVar4);
  poVar1 = std::operator<<((ostream *)&std::cout,"  Universal Time:");
  poVar1 = std::operator<<(poVar1,buf);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"- Boost.Locale\'s locale: ");
  booster::locale::generator::generator((generator *)&loc);
  std::__cxx11::string::string((string *)buf,"",&local_431);
  booster::locale::generator::generate((string *)&l);
  std::__cxx11::string::~string((string *)buf);
  piVar5 = std::use_facet<booster::locale::info>(&l);
  (**(code **)(*(long *)piVar5 + 0x10))(buf,piVar5,4);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)buf);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)buf);
  std::locale::~locale(&l);
  booster::locale::generator::~generator((generator *)&loc);
  return 0;
}

Assistant:

int main()
{
    std::cout << "- Backends: ";
    #ifdef BOOSTER_LOCALE_WITH_ICU
    std::cout << "icu:" << U_ICU_VERSION << " ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_STD_BACKEND
    std::cout << "std ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_POSIX_BACKEND
    std::cout << "posix ";
    #endif
    #ifndef BOOSTER_LOCALE_NO_WINAPI_BACKEND
    std::cout << "winapi";
    #endif
    std::cout << std::endl;
    #ifdef BOOSTER_LOCALE_WITH_ICONV
    std::cout << "- With iconv" << std::endl;
    #else
    std::cout << "- Without iconv" << std::endl;
    #endif
    std::cout << "- Environment " << std::endl;
    std::cout << "  LANG="<< env("LANG") << std::endl;
    std::cout << "  LC_ALL="<< env("LC_ALL") << std::endl;
    std::cout << "  LC_CTYPE="<< env("LC_CTYPE") << std::endl;
    std::cout << "  TZ="<< env("TZ") << std::endl;

    char const *clocale=setlocale(LC_ALL,"");
    if(!clocale)
        clocale= "undetected";
    std::cout <<"- C locale: " << clocale << std::endl;

    try {
        std::locale loc("");
        std::cout << "- C++ locale: " << loc.name() << std::endl;
    }
    catch(std::exception const &) {
        std::cout << "- C++ locale: is not supported" << std::endl;
    }

    char const *locales_to_check[] = {
        "en_US.UTF-8", "en_US.ISO8859-1", "English_United States.1252",
        "he_IL.UTF-8", "he_IL.ISO8859-8", "Hebrew_Israel.1255",
        "ru_RU.UTF-8", "Russian_Russia.1251",
        "tr_TR.UTF-8", "Turkish_Turkey.1254",
        "ja_JP.UTF-8", "ja_JP.SJIS", "Japanese_Japan.932",
        0
    };
    std::cout << "- Testing locales availability on the operation system:" << std::endl;
    check_locale(locales_to_check);
    std::cout << "--- Testing Japanese_Japan.932 is working: " << test_std_supports_SJIS_codecvt("Japanese_Japan.932") << std::endl;

    std::cout << "- Testing timezone and time " << std::endl;
    {
        setlocale(LC_ALL,"C");
        time_t now = time(0);
        char buf[1024];
        strftime(buf,sizeof(buf),"%%c=%c; %%Z=%Z; %%z=%z",localtime(&now));
        std::cout << "  Local Time    :" << buf << std::endl;
        strftime(buf,sizeof(buf),"%%c=%c; %%Z=%Z; %%z=%z",gmtime(&now));
        std::cout << "  Universal Time:" << buf << std::endl;
    }
    std::cout << "- Boost.Locale's locale: ";
    try {
        booster::locale::generator gen;
        std::locale l = gen("");
        std::cout << std::use_facet<booster::locale::info>(l).name() << std::endl;
    }
    catch(std::exception const &) {
        std::cout << " undetected" << std::endl;
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;

}